

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

int xmlSerializeDecCharRef(char *buf,int val)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  buf[0] = '&';
  buf[1] = '#';
  if (val < 100) {
    uVar1 = (9 < val) + 1;
  }
  else {
    if ((uint)val < 10000) {
      bVar4 = (uint)val < 1000;
      iVar2 = 4;
    }
    else {
      uVar1 = 7;
      if (999999 < (uint)val) goto LAB_0012e916;
      bVar4 = (uint)val < 100000;
      iVar2 = 6;
    }
    uVar1 = iVar2 - (uint)bVar4;
  }
LAB_0012e916:
  uVar3 = (ulong)uVar1 + 1;
  do {
    buf[uVar3] = (char)val + (char)(val / 10) * -10 + '0';
    uVar3 = uVar3 - 1;
    val = val / 10;
  } while (1 < uVar3);
  buf[(ulong)uVar1 + 2] = ';';
  return uVar1 + 3;
}

Assistant:

int
xmlSerializeDecCharRef(char *buf, int val) {
    char *out = buf;
    int len, i;

    *out++ = '&';
    *out++ = '#';

    if (val < 100) {
        len = (val < 10) ? 1 : 2;
    } else if (val < 10000) {
        len = (val < 1000) ? 3 : 4;
    } else if (val < 1000000) {
        len = (val < 100000) ? 5 : 6;
    } else {
        len = 7;
    }

    for (i = len - 1; i >= 0; i--) {
        out[i] = '0' + val % 10;
        val /= 10;
    }

    out[len] = ';';

    return(len + 3);
}